

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3DoOptimize(Fts3Table *p,int bReturnDone)

{
  sqlite3_stmt *pStmt;
  int iVar1;
  int iVar2;
  Mem *pMem;
  i64 iVar3;
  bool bVar4;
  sqlite3_stmt *pAllLangid;
  sqlite3_stmt *local_38;
  
  local_38 = (sqlite3_stmt *)0x0;
  bVar4 = false;
  iVar1 = fts3SqlStmt(p,0x1b,&local_38,(sqlite3_value **)0x0);
  pStmt = local_38;
  if (iVar1 == 0) {
    sqlite3_bind_int64(local_38,1,(long)p->iPrevLangid);
    sqlite3_bind_int64(pStmt,2,(long)p->nIndex);
    iVar1 = sqlite3_step(pStmt);
    if (iVar1 == 100) {
      bVar4 = false;
      iVar2 = 0;
      do {
        pMem = columnMem(pStmt,0);
        iVar3 = sqlite3VdbeIntValue(pMem);
        columnMallocFailure(pStmt);
        if (iVar2 == 0) {
          for (iVar1 = 0; iVar1 < p->nIndex; iVar1 = iVar1 + 1) {
            iVar2 = fts3SegmentMerge(p,(int)iVar3,iVar1,-2);
            if (iVar2 == 0x65) {
              bVar4 = true;
            }
            else if (iVar2 != 0) goto LAB_001c1b65;
          }
          iVar2 = 0;
        }
LAB_001c1b65:
        iVar1 = sqlite3_step(pStmt);
      } while (iVar1 == 100);
      iVar1 = sqlite3_reset(pStmt);
      if (iVar2 != 0) {
        iVar1 = iVar2;
      }
    }
    else {
      iVar1 = sqlite3_reset(pStmt);
      bVar4 = false;
    }
  }
  sqlite3_blob_close(p->pSegments);
  p->pSegments = (sqlite3_blob *)0x0;
  sqlite3Fts3PendingTermsClear(p);
  iVar2 = 0x65;
  if (!bVar4) {
    iVar2 = iVar1;
  }
  if (iVar1 != 0) {
    iVar2 = iVar1;
  }
  if (bReturnDone == 0) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

static int fts3DoOptimize(Fts3Table *p, int bReturnDone){
  int bSeenDone = 0;
  int rc;
  sqlite3_stmt *pAllLangid = 0;

  rc = fts3SqlStmt(p, SQL_SELECT_ALL_LANGID, &pAllLangid, 0);
  if( rc==SQLITE_OK ){
    int rc2;
    sqlite3_bind_int(pAllLangid, 1, p->iPrevLangid);
    sqlite3_bind_int(pAllLangid, 2, p->nIndex);
    while( sqlite3_step(pAllLangid)==SQLITE_ROW ){
      int i;
      int iLangid = sqlite3_column_int(pAllLangid, 0);
      for(i=0; rc==SQLITE_OK && i<p->nIndex; i++){
        rc = fts3SegmentMerge(p, iLangid, i, FTS3_SEGCURSOR_ALL);
        if( rc==SQLITE_DONE ){
          bSeenDone = 1;
          rc = SQLITE_OK;
        }
      }
    }
    rc2 = sqlite3_reset(pAllLangid);
    if( rc==SQLITE_OK ) rc = rc2;
  }

  sqlite3Fts3SegmentsClose(p);
  sqlite3Fts3PendingTermsClear(p);

  return (rc==SQLITE_OK && bReturnDone && bSeenDone) ? SQLITE_DONE : rc;
}